

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# isac.c
# Opt level: O2

int16_t WebRtcIsac_UpdateUplinkBw(ISACStruct *ISAC_main_inst,int16_t bweIndex)

{
  int16_t iVar1;
  short sVar2;
  
  sVar2 = 0x190a;
  if (((byte)ISAC_main_inst[0x538e0] & 2) != 0) {
    iVar1 = WebRtcIsac_UpdateUplinkBwImpl
                      ((BwEstimatorstr *)(ISAC_main_inst + 0x537b0),bweIndex,
                       *(IsacSamplingRate *)(ISAC_main_inst + 0x538d8));
    if (-1 < iVar1) {
      return 0;
    }
    sVar2 = -iVar1;
  }
  *(short *)(ISAC_main_inst + 0x538d0) = sVar2;
  return -1;
}

Assistant:

int16_t WebRtcIsac_UpdateUplinkBw(ISACStruct* ISAC_main_inst,
                                  int16_t bweIndex) {
  ISACMainStruct* instISAC = (ISACMainStruct*)ISAC_main_inst;
  int16_t returnVal;

  /* Check if encoder initiated. */
  if ((instISAC->initFlag & BIT_MASK_ENC_INIT) !=
      BIT_MASK_ENC_INIT) {
    instISAC->errorCode = ISAC_ENCODER_NOT_INITIATED;
    return -1;
  }

  /* Call function to get Bandwidth Estimate. */
  returnVal = WebRtcIsac_UpdateUplinkBwImpl(
                &(instISAC->bwestimator_obj), bweIndex,
                instISAC->encoderSamplingRateKHz);

  if (returnVal < 0) {
    instISAC->errorCode = -returnVal;
    return -1;
  } else {
    return 0;
  }
}